

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_memory_events.cpp
# Opt level: O3

void kokkosp_allocate_data(SpaceHandle space,char *label,void *ptr,uint64_t size)

{
  iterator iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 *__s1;
  ulong uVar8;
  double dVar9;
  tuple<double,_unsigned_long,_double> tStack_168;
  EventRecord EStack_150;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)KokkosTools::MemoryEvents::m);
  if (iVar3 != 0) {
    uVar5 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)KokkosTools::MemoryEvents::m);
    _Unwind_Resume(uVar5);
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  uVar2 = KokkosTools::MemoryEvents::num_spaces;
  dVar9 = (double)(lVar4 - KokkosTools::MemoryEvents::timer) / 1000000000.0;
  lVar4 = (long)(int)KokkosTools::MemoryEvents::num_spaces;
  uVar7 = KokkosTools::MemoryEvents::num_spaces;
  if (0 < lVar4) {
    uVar6 = (ulong)KokkosTools::MemoryEvents::num_spaces;
    __s1 = KokkosTools::MemoryEvents::space_name;
    uVar8 = 0;
    do {
      iVar3 = strcmp(__s1,space.name);
      if (iVar3 == 0) {
        uVar7 = (uint)uVar8;
      }
      uVar8 = uVar8 + 1;
      __s1 = __s1 + 0x40;
    } while (uVar6 != uVar8);
    if (uVar7 != uVar2) goto LAB_00102858;
  }
  strncpy(KokkosTools::MemoryEvents::space_name + lVar4 * 0x40,space.name,0x40);
  KokkosTools::MemoryEvents::num_spaces = uVar2 + 1;
LAB_00102858:
  lVar4 = (long)(int)uVar7;
  (&KokkosTools::MemoryEvents::space_size)[lVar4] =
       (&KokkosTools::MemoryEvents::space_size)[lVar4] + size;
  getrusage(RUSAGE_SELF,(rusage *)&EStack_150);
  tStack_168.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
  super__Tuple_impl<1UL,_unsigned_long,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl =
       (_Head_base<2UL,_double,_false>)((double)(long)EStack_150.name._0_8_ * 1024.0);
  tStack_168.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
  super__Tuple_impl<1UL,_unsigned_long,_double>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = (&KokkosTools::MemoryEvents::space_size)[lVar4];
  tStack_168.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar9;
  std::
  vector<std::tuple<double,unsigned_long,double>,std::allocator<std::tuple<double,unsigned_long,double>>>
  ::emplace_back<std::tuple<double,unsigned_long,double>>
            ((vector<std::tuple<double,unsigned_long,double>,std::allocator<std::tuple<double,unsigned_long,double>>>
              *)(&KokkosTools::MemoryEvents::space_size_track + lVar4 * 3),&tStack_168);
  EStack_150.operation = 1;
  EStack_150.ptr = ptr;
  EStack_150.size = size;
  EStack_150.space = uVar7;
  EStack_150.time = dVar9;
  strncpy(EStack_150.name,label,0x100);
  iVar1._M_current = DAT_00106558._M_current;
  if (DAT_00106558._M_current == DAT_00106560) {
    std::
    vector<KokkosTools::MemoryEvents::EventRecord,_std::allocator<KokkosTools::MemoryEvents::EventRecord>_>
    ::_M_realloc_insert<KokkosTools::MemoryEvents::EventRecord>
              ((vector<KokkosTools::MemoryEvents::EventRecord,_std::allocator<KokkosTools::MemoryEvents::EventRecord>_>
                *)&KokkosTools::MemoryEvents::events,DAT_00106558,&EStack_150);
  }
  else {
    memcpy(DAT_00106558._M_current,&EStack_150,0x120);
    DAT_00106558._M_current = iVar1._M_current + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)KokkosTools::MemoryEvents::m);
  return;
}

Assistant:

void kokkosp_allocate_data(const SpaceHandle space, const char* label,
                           const void* const ptr, const uint64_t size) {
  std::lock_guard<std::mutex> lock(m);

  double time = timer.seconds();

  int space_i = num_spaces;
  for (int s = 0; s < num_spaces; s++)
    if (strcmp(space_name[s], space.name) == 0) space_i = s;

  if (space_i == num_spaces) {
    strncpy(space_name[num_spaces], space.name, 64);
    num_spaces++;
  }
  space_size[space_i] += size;
  space_size_track[space_i].push_back(
      std::make_tuple(time, space_size[space_i], max_mem_usage()));

  events.push_back(
      EventRecord(ptr, size, MEMOP_ALLOCATE, space_i, time, label));
}